

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void __thiscall fmt::v7::detail::bigint::square(bigint *this)

{
  long lVar1;
  int iVar2;
  int i;
  type tVar3;
  long lVar4;
  _func_int **pp_Var5;
  int j;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  int value;
  size_t sVar12;
  ulong uVar13;
  bool bVar14;
  undefined1 local_f0 [8];
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> n;
  
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::basic_memory_buffer
            ((basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> *)local_f0,
             &this->bigits_);
  sVar12 = (this->bigits_).super_buffer<unsigned_int>.size_;
  iVar2 = (int)sVar12;
  tVar3 = to_unsigned<int>(iVar2 * 2);
  buffer<unsigned_int>::try_resize((buffer<unsigned_int> *)this,(ulong)tVar3);
  uVar10 = 0;
  iVar9 = 0;
  if (0 < iVar2) {
    iVar9 = iVar2;
  }
  uVar11 = 0;
  uVar13 = 0;
  for (; pp_Var5 = n.super_buffer<unsigned_int>._vptr_buffer, uVar6 = uVar10, (int)uVar10 != iVar9;
      uVar10 = uVar10 + 1) {
    for (; uVar6 != 0xffffffffffffffff; uVar6 = uVar6 - 1) {
      uVar8 = (ulong)*(uint *)((long)n.super_buffer<unsigned_int>._vptr_buffer +
                              (uVar6 & 0xffffffff) * 4) * (ulong)*(uint *)pp_Var5;
      bVar14 = CARRY8(uVar11,uVar8);
      uVar11 = uVar11 + uVar8;
      uVar13 = uVar13 + bVar14;
      pp_Var5 = (_func_int **)((long)pp_Var5 + 4);
    }
    tVar3 = to_unsigned<int>((int)uVar10);
    (this->bigits_).super_buffer<unsigned_int>.ptr_[tVar3] = (uint)uVar11;
    uVar11 = uVar11 >> 0x20 | uVar13 << 0x20;
    uVar13 = uVar13 >> 0x20;
  }
  n._160_8_ = SEXT48(iVar2 + -1);
  iVar9 = 1;
  while (value = (int)sVar12, value < iVar2 * 2) {
    lVar7 = n._160_8_;
    for (lVar4 = (long)iVar9; lVar4 < iVar2; lVar4 = lVar4 + 1) {
      lVar1 = lVar7 * 4;
      lVar7 = lVar7 + -1;
      uVar10 = (ulong)*(uint *)((long)n.super_buffer<unsigned_int>._vptr_buffer + lVar1) *
               (ulong)*(uint *)((long)n.super_buffer<unsigned_int>._vptr_buffer + lVar4 * 4);
      bVar14 = CARRY8(uVar11,uVar10);
      uVar11 = uVar11 + uVar10;
      uVar13 = uVar13 + bVar14;
    }
    tVar3 = to_unsigned<int>(value);
    (this->bigits_).super_buffer<unsigned_int>.ptr_[tVar3] = (uint)uVar11;
    uVar11 = uVar11 >> 0x20 | uVar13 << 0x20;
    uVar13 = uVar13 >> 0x20;
    iVar9 = iVar9 + 1;
    sVar12 = (size_t)(value + 1);
  }
  remove_leading_zeros(this);
  this->exp_ = this->exp_ << 1;
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::~basic_memory_buffer
            ((basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> *)local_f0);
  return;
}

Assistant:

void square() {
    basic_memory_buffer<bigit, bigits_capacity> n(std::move(bigits_));
    int num_bigits = static_cast<int>(bigits_.size());
    int num_result_bigits = 2 * num_bigits;
    bigits_.resize(to_unsigned(num_result_bigits));
    using accumulator_t = conditional_t<FMT_USE_INT128, uint128_t, accumulator>;
    auto sum = accumulator_t();
    for (int bigit_index = 0; bigit_index < num_bigits; ++bigit_index) {
      // Compute bigit at position bigit_index of the result by adding
      // cross-product terms n[i] * n[j] such that i + j == bigit_index.
      for (int i = 0, j = bigit_index; j >= 0; ++i, --j) {
        // Most terms are multiplied twice which can be optimized in the future.
        sum += static_cast<double_bigit>(n[i]) * n[j];
      }
      (*this)[bigit_index] = static_cast<bigit>(sum);
      sum >>= bits<bigit>::value;  // Compute the carry.
    }
    // Do the same for the top half.
    for (int bigit_index = num_bigits; bigit_index < num_result_bigits;
         ++bigit_index) {
      for (int j = num_bigits - 1, i = bigit_index - j; i < num_bigits;)
        sum += static_cast<double_bigit>(n[i++]) * n[j--];
      (*this)[bigit_index] = static_cast<bigit>(sum);
      sum >>= bits<bigit>::value;
    }
    --num_result_bigits;
    remove_leading_zeros();
    exp_ *= 2;
  }